

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::metrics::MetricsTest_testReset_Test::TestBody(MetricsTest_testReset_Test *this)

{
  unique_ptr<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
  uVar1;
  __uniq_ptr_data<jaegertracing::metrics::Gauge,_std::default_delete<jaegertracing::metrics::Gauge>,_true,_true>
  _Var2;
  AssertionResult *pAVar3;
  char *pcVar4;
  bool bVar5;
  int local_58 [2];
  AssertHelper local_50 [8];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  
  uVar1._M_t.
  super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
  ._M_t.
  super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
  .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl =
       (((this->super_MetricsTest)._metrics._M_t.
         super___uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
         ._M_t.
         super__Tuple_impl<0UL,_jaegertracing::metrics::Metrics_*,_std::default_delete<jaegertracing::metrics::Metrics>_>
         .super__Head_base<0UL,_jaegertracing::metrics::Metrics_*,_false>._M_head_impl)->
       _tracesStartedSampled)._M_t;
  (**(code **)(*(long *)uVar1._M_t.
                        super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
                        .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>.
                        _M_head_impl + 0x10))
            (uVar1._M_t.
             super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
             .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl,1);
  local_58[0] = 1;
  gtest_ar_.success_ = (bool)(this->super_MetricsTest).field_0x30;
  gtest_ar_._1_7_ = *(undefined7 *)&(this->super_MetricsTest).field_0x31;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"1","counters.size()",local_58,(unsigned_long *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
               ,0x5c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)&gtest_ar_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    _Var2.
    super___uniq_ptr_impl<jaegertracing::metrics::Gauge,_std::default_delete<jaegertracing::metrics::Gauge>_>
    ._M_t.
    super__Tuple_impl<0UL,_jaegertracing::metrics::Gauge_*,_std::default_delete<jaegertracing::metrics::Gauge>_>
    .super__Head_base<0UL,_jaegertracing::metrics::Gauge_*,_false>._M_head_impl =
         (((this->super_MetricsTest)._metrics._M_t.
           super___uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
           ._M_t.
           super__Tuple_impl<0UL,_jaegertracing::metrics::Metrics_*,_std::default_delete<jaegertracing::metrics::Metrics>_>
           .super__Head_base<0UL,_jaegertracing::metrics::Metrics_*,_false>._M_head_impl)->
         _reporterQueueLength)._M_t.
         super___uniq_ptr_impl<jaegertracing::metrics::Gauge,_std::default_delete<jaegertracing::metrics::Gauge>_>
    ;
    (**(code **)(*(long *)_Var2.
                          super___uniq_ptr_impl<jaegertracing::metrics::Gauge,_std::default_delete<jaegertracing::metrics::Gauge>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_jaegertracing::metrics::Gauge_*,_std::default_delete<jaegertracing::metrics::Gauge>_>
                          .super__Head_base<0UL,_jaegertracing::metrics::Gauge_*,_false>.
                          _M_head_impl + 0x10))
              (_Var2.
               super___uniq_ptr_impl<jaegertracing::metrics::Gauge,_std::default_delete<jaegertracing::metrics::Gauge>_>
               ._M_t.
               super__Tuple_impl<0UL,_jaegertracing::metrics::Gauge_*,_std::default_delete<jaegertracing::metrics::Gauge>_>
               .super__Head_base<0UL,_jaegertracing::metrics::Gauge_*,_false>._M_head_impl,1);
    local_58[0] = 1;
    gtest_ar_.success_ = (bool)(this->super_MetricsTest).field_0x68;
    gtest_ar_._1_7_ = *(undefined7 *)&(this->super_MetricsTest).field_0x69;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&gtest_ar,"1","gauges.size()",local_58,(unsigned_long *)&gtest_ar_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
                 ,0x60,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)&gtest_ar_);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      std::__cxx11::string::string((string *)&gtest_ar,"jaeger.test-timer",(allocator *)&gtest_ar_);
      StatsReporter::recordTimer
                ((StatsReporter *)&(this->super_MetricsTest)._metricsReporter,(string *)&gtest_ar,1)
      ;
      std::__cxx11::string::~string((string *)&gtest_ar);
      local_58[0] = 1;
      gtest_ar_.success_ = (bool)(this->super_MetricsTest).field_0xa0;
      gtest_ar_._1_7_ = *(undefined7 *)&(this->super_MetricsTest).field_0xa1;
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)&gtest_ar,"1","timers.size()",local_58,(unsigned_long *)&gtest_ar_);
      if (gtest_ar.success_ != false) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        jaegertracing::metrics::InMemoryStatsReporter::reset();
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        bVar5 = *(long *)&(this->super_MetricsTest).field_0x30 == 0;
        gtest_ar_.success_ = bVar5;
        if (bVar5) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          bVar5 = *(long *)&(this->super_MetricsTest).field_0x68 == 0;
          gtest_ar_.success_ = bVar5;
          if (!bVar5) {
            testing::Message::Message((Message *)local_58);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&gtest_ar,&gtest_ar_.success_,"gauges.empty()","false");
            testing::internal::AssertHelper::AssertHelper
                      (local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
                       ,0x6a,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=(local_50,(Message *)local_58);
            goto LAB_001b7b11;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          bVar5 = *(long *)&(this->super_MetricsTest).field_0xa0 == 0;
          gtest_ar_.success_ = bVar5;
          if (!bVar5) {
            testing::Message::Message((Message *)local_58);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&gtest_ar,&gtest_ar_.success_,"timers.empty()","false");
            testing::internal::AssertHelper::AssertHelper
                      (local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
                       ,0x6b,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=(local_50,(Message *)local_58);
            goto LAB_001b7b11;
          }
        }
        else {
          testing::Message::Message((Message *)local_58);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&gtest_ar,&gtest_ar_.success_,"counters.empty()","false");
          testing::internal::AssertHelper::AssertHelper
                    (local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
                     ,0x69,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(local_50,(Message *)local_58);
LAB_001b7b11:
          testing::internal::AssertHelper::~AssertHelper(local_50);
          std::__cxx11::string::~string((string *)&gtest_ar);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_58);
        }
        pAVar3 = &gtest_ar_;
        goto LAB_001b7a8b;
      }
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
                 ,0x66,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)&gtest_ar_);
    }
  }
  pAVar3 = &gtest_ar;
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_58);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
LAB_001b7a8b:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&pAVar3->message_);
  return;
}

Assistant:

TEST_F(MetricsTest, testReset)
{
    _metrics->tracesStartedSampled().inc(1);
    const auto& counters = _metricsReporter.counters();
    ASSERT_EQ(1, counters.size());

    _metrics->reporterQueueLength().update(1);
    const auto& gauges = _metricsReporter.gauges();
    ASSERT_EQ(1, gauges.size());

    constexpr auto time = static_cast<int64_t>(1);
    constexpr auto timerName = "jaeger.test-timer";
    _metricsReporter.recordTimer(timerName, time);
    const auto& timers = _metricsReporter.timers();
    ASSERT_EQ(1, timers.size());

    _metricsReporter.reset();
    ASSERT_TRUE(counters.empty());
    ASSERT_TRUE(gauges.empty());
    ASSERT_TRUE(timers.empty());
}